

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowlev2.c
# Opt level: O0

LispPTR N_OP_getbasebyte(LispPTR base_addr,LispPTR byteoffset)

{
  LispPTR *pLVar1;
  DLword *pDVar2;
  uint local_14;
  LispPTR byteoffset_local;
  LispPTR base_addr_local;
  
  if ((byteoffset & 0xfff0000) == 0xe0000) {
    local_14 = byteoffset & 0xffff;
  }
  else if ((byteoffset & 0xfff0000) == 0xf0000) {
    local_14 = byteoffset | 0xffff0000;
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (byteoffset >> 9)) ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = byteoffset;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar1 = NativeAligned4FromLAddr(byteoffset);
    local_14 = *pLVar1;
  }
  pDVar2 = NativeAligned2FromLAddr(base_addr & 0xfffffff);
  return *(byte *)((long)pDVar2 + (ulong)local_14 ^ 3) | 0xe0000;
}

Assistant:

LispPTR N_OP_getbasebyte(LispPTR base_addr, LispPTR byteoffset) {
  switch ((SEGMASK & byteoffset)) {
    case S_POSITIVE: byteoffset = byteoffset & 0x0000FFFF; break;
    case S_NEGATIVE: byteoffset = byteoffset | 0xFFFF0000; break;
    default:
      switch ((GetTypeNumber(byteoffset))) {
        case TYPE_FIXP: byteoffset = *((int *)NativeAligned4FromLAddr(byteoffset)); break;
        default: /* floatp also fall thru */ ERROR_EXIT(byteoffset);
      } /* end switch */
      break;
  } /* end switch */
  return ((0xFF & (GETBYTE((char *)NativeAligned2FromLAddr((POINTERMASK & base_addr)) + byteoffset))) |
          S_POSITIVE);
}